

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

source_position
mjs::calc_source_position
          (wstring_view *t,uint32_t start_pos,uint32_t end_pos,source_position *start)

{
  wchar_t wVar1;
  int iVar2;
  source_position sVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar8 = (ulong)start_pos;
  if (((t->_M_len < uVar8) || (end_pos < start_pos)) || (t->_M_len < (ulong)end_pos)) {
    __assert_fail("start_pos <= t.size() && end_pos <= t.size() && start_pos <= end_pos",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x2e,
                  "source_position mjs::calc_source_position(const std::wstring_view &, uint32_t, uint32_t, const source_position &)"
                 );
  }
  iVar5 = start->column;
  iVar2 = start->line + -1;
  iVar6 = iVar2;
  if (start_pos < end_pos) {
    uVar4 = iVar5 - 1;
    do {
      wVar1 = t->_M_str[uVar8];
      if (wVar1 == L'\t') {
        uVar7 = uVar4 + 7;
        if (-1 < (int)uVar4) {
          uVar7 = uVar4;
        }
        uVar4 = (uVar7 & 0xfffffff8) + 8;
      }
      else {
        if (wVar1 == L'\r') {
          iVar6 = iVar6 + 1;
        }
        else {
          if (wVar1 != L'\n') {
            uVar4 = uVar4 + 1;
            goto LAB_001776c9;
          }
          iVar2 = iVar2 + 1;
        }
        uVar4 = 0;
      }
LAB_001776c9:
      uVar8 = uVar8 + 1;
    } while (end_pos != uVar8);
    iVar5 = uVar4 + 1;
  }
  if (iVar2 < iVar6) {
    iVar2 = iVar6;
  }
  sVar3.line = iVar2 + 1;
  sVar3.column = iVar5;
  return sVar3;
}

Assistant:

source_position calc_source_position(const std::wstring_view& t, uint32_t start_pos, uint32_t end_pos, const source_position& start) {
    assert(start_pos <= t.size() && end_pos <= t.size() && start_pos <= end_pos);
    int cr = start.line-1, lf = start.line-1;
    int column = start.column-1;
    constexpr int tabstop = 8;
    for (uint32_t i = start_pos; i < end_pos; ++i) {
        switch (t[i]) {
        case '\n': ++lf; column = 0; break;
        case '\r': ++cr; column = 0; break;
        case '\t': column += tabstop - (column % tabstop); break;
        default: ++column;
        }
    }
    return {1 + std::max(cr, lf), 1 + column};
}